

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce-operations.hpp
# Opt level: O1

void diy::all_to_all<void(*)(void*,diy::ReduceProxy_const&)>
               (Master *master,Assigner *assigner,_func_void_void_ptr_ReduceProxy_ptr **op,int k)

{
  int iVar1;
  BoolVector local_2f8;
  BoolVector local_2c8;
  DivisionsVector local_298;
  CoordinateVector local_278;
  string local_260;
  RegularSwapPartners partners;
  size_t local_1d0;
  pointer local_1c8;
  SkipIntermediate local_1c0;
  AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> local_1b8;
  Scoped scoped;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"all_to_all","");
  stats::Profiler::scoped(&scoped,&master->prof,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  iVar1 = assigner->nblocks_;
  Bounds<int>::Bounds((Bounds<int> *)&partners,1);
  *partners.super_RegularPartners.divisions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_finish = 0;
  *partners.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = iVar1 + -1;
  local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = 0;
  local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = 0;
  local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = 0;
  local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = 0;
  local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (&decomposer,1,(Bounds *)&partners,assigner->nblocks_,&local_2c8,&local_2f8,&local_278,
             &local_298);
  if (local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_2f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_1c8 != (pointer)0x0) {
    operator_delete(local_1c8,local_1d0 << 2);
  }
  partners.super_RegularPartners.divisions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       partners.super_RegularPartners.divisions_.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (partners.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(partners.super_RegularPartners.steps_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,partners.super_RegularPartners._48_8_ << 2);
  }
  RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
            (&partners.super_RegularPartners,&decomposer,k,false);
  detail::AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)>::AllToAllReduce
            (&local_1b8,op,assigner);
  local_1c0.rounds =
       (long)partners.super_RegularPartners.kvs_.
             super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)partners.super_RegularPartners.kvs_.
             super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  reduce<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>,diy::RegularSwapPartners,diy::detail::SkipIntermediate>
            (master,assigner,&partners,&local_1b8,&local_1c0);
  local_1b8.empty_link.super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__001db5a0;
  if (local_1b8.empty_link.neighbors_.
      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.empty_link.neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.empty_link.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.empty_link.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1b8.all_neighbors_link.super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__001db5a0;
  if (local_1b8.all_neighbors_link.neighbors_.
      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.all_neighbors_link.neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.all_neighbors_link.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.all_neighbors_link.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (partners.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(partners.super_RegularPartners.steps_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)partners.super_RegularPartners.steps_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)partners.super_RegularPartners.steps_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (partners.super_RegularPartners.kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(partners.super_RegularPartners.kvs_.
                    super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)partners.super_RegularPartners.kvs_.
                          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)partners.super_RegularPartners.kvs_.
                          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (partners.super_RegularPartners.divisions_.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(partners.super_RegularPartners.divisions_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)partners.super_RegularPartners.divisions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)partners.super_RegularPartners.divisions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(&decomposer);
  stats::ScopedProfile<diy::stats::Profiler>::~ScopedProfile(&scoped);
  return;
}

Assistant:

void
all_to_all(Master&              master,     //!< block owner
           const Assigner&      assigner,   //!< global block locator (maps gid to proc)
           const Op&            op,         //!< user-defined operation called to enqueue and dequeue items
           int                  k = 2       //!< reduction fanout
          )
{
  auto scoped = master.prof.scoped("all_to_all");
  (void)scoped;
  RegularDecomposer<DiscreteBounds> decomposer(1, interval(0,assigner.nblocks()-1), assigner.nblocks());
  RegularSwapPartners  partners(decomposer, k, false);
  reduce(master, assigner, partners, detail::AllToAllReduce<Op>(op, assigner), detail::SkipIntermediate(partners.rounds()));
}